

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_func_get_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  void *pvVar2;
  jx9_value *pValue;
  jx9_value *pValue_00;
  uint local_4c;
  sxu32 n;
  VmSlot *aSlot;
  VmFrame *pFrame;
  jx9_value *pArray;
  jx9_value *pObj;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    jx9_context_throw_error(pCtx,2,"Called in the global scope");
    jx9_result_bool(pCtx,0);
  }
  else {
    pValue = jx9_context_new_array(pCtx);
    if (pValue == (jx9_value *)0x0) {
      jx9_result_bool(pCtx,0);
    }
    else {
      pvVar2 = (pVVar1->sArg).pBase;
      for (local_4c = 0; local_4c < (pVVar1->sArg).nUsed; local_4c = local_4c + 1) {
        pValue_00 = (jx9_value *)
                    SySetAt(&pCtx->pVm->aMemObj,*(sxu32 *)((long)pvVar2 + (ulong)local_4c * 0x10));
        if (pValue_00 != (jx9_value *)0x0) {
          jx9_array_add_elem(pValue,(jx9_value *)0x0,pValue_00);
        }
      }
      jx9_result_value(pCtx,pValue);
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_func_get_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	jx9_value *pArray;
	VmFrame *pFrame;
	VmSlot *aSlot;
	sxu32 n;
	/* Point to the current frame */
	pFrame = pCtx->pVm->pFrame;
	if( pFrame->pParent == 0 ){
		/* Global frame, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Start filling the array with the given arguments */
	aSlot = (VmSlot *)SySetBasePtr(&pFrame->sArg);
	for( n = 0;  n < SySetUsed(&pFrame->sArg) ; n++ ){
		pObj = (jx9_value *)SySetAt(&pCtx->pVm->aMemObj, aSlot[n].nIdx);
		if( pObj ){
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pObj);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}